

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall mir::inst::CallInst::~CallInst(CallInst *this)

{
  CallInst *in_RDI;
  
  ~CallInst(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

virtual ~CallInst() {}